

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

string * __thiscall pbrt::HaltonSampler::ToString_abi_cxx11_(HaltonSampler *this)

{
  string *in_RDI;
  int *in_stack_00000008;
  Point2<int> *in_stack_00000010;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
  **in_stack_00000020;
  char *in_stack_00000028;
  int *in_stack_00000040;
  int *in_stack_00000048;
  
  StringPrintf<pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>*const&,pbrt::HaltonPixelIndexer_const&,pbrt::Point2<int>const&,int_const&,int_const&,int_const&>
            (in_stack_00000028,in_stack_00000020,(HaltonPixelIndexer *)this,in_stack_00000010,
             in_stack_00000008,in_stack_00000040,in_stack_00000048);
  return in_RDI;
}

Assistant:

std::string HaltonSampler::ToString() const {
    return StringPrintf("[ HaltonSampler digitPermutations: %p haltonPixelIndexer: %s "
                        "pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d ]",
                        digitPermutations, haltonPixelIndexer, pixel, sampleIndex,
                        dimension, samplesPerPixel);
}